

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-options.c
# Opt level: O0

void ego_menu(char *unused,wchar_t also_unused)

{
  _func_void_menu_ptr **menu_00;
  _Bool _Var1;
  void *__base;
  ego_item *ego_00;
  char *pcVar2;
  ignore_type_t local_11c;
  int local_118;
  wchar_t itype;
  wchar_t i;
  wchar_t cursor;
  region area;
  menu_iter menu_f;
  menu menu;
  ego_desc *choice;
  ego_item *ego;
  wchar_t max_num;
  wchar_t also_unused_local;
  char *unused_local;
  
  ego._0_4_ = 0;
  memcpy(&area.width,&DAT_00362c20,0x28);
  i = 1;
  cursor = 5;
  area.col = -1;
  area.row = -1;
  __base = mem_zalloc((long)(int)((uint)z_info->e_max * 0x1b) << 4);
  for (local_118 = 0; local_118 < (int)(uint)z_info->e_max; local_118 = local_118 + 1) {
    ego_00 = e_info + local_118;
    if ((ego_00->name != (char *)0x0) && ((ego_00->everseen & 1U) != 0)) {
      for (local_11c = ITYPE_SHARP; (int)local_11c < 0x1b; local_11c = local_11c + ITYPE_SHARP) {
        _Var1 = ego_has_ignore_type(ego_00,local_11c);
        if (_Var1) {
          *(short *)((long)__base + (long)(int)ego * 0x10) = (short)local_118;
          *(short *)((long)__base + (long)(int)ego * 0x10 + 2) = (short)local_11c;
          pcVar2 = strip_ego_name(ego_00->name);
          *(char **)((long)__base + (long)(int)ego * 0x10 + 8) = pcVar2;
          ego._0_4_ = (int)ego + 1;
        }
      }
    }
  }
  qsort(__base,(long)(int)ego,0x10,ego_comp_func);
  if ((int)ego == 0) {
    mem_free(__base);
  }
  else {
    screen_save();
    clear_from(L'\0');
    prt("Ego item ignore menu",L'\0',L'\0');
    text_out_hook = text_out_to_screen;
    text_out_indent = L'\x01';
    text_out_wrap = L'O';
    Term_gotoxy(L'\x01',L'\x01');
    text_out_e(
              "{light green}Movement keys{/} scroll the list\n{light red}ESC{/} returns to the previous menu\n{light blue}Enter{/} toggles the current setting."
              );
    text_out_indent = L'\0';
    menu_f.resize = (_func_void_menu_ptr *)0x0;
    menu_00 = &menu_f.resize;
    menu_init((menu *)menu_00,MN_SKIN_SCROLL,(menu_iter *)&area.width);
    menu_setpriv((menu *)menu_00,(int)ego,__base);
    menu_layout((menu *)menu_00,(region *)&i);
    menu_select((menu *)menu_00,0,false);
    mem_free(__base);
    screen_load();
  }
  return;
}

Assistant:

static void ego_menu(const char *unused, int also_unused)
{
	int max_num = 0;
	struct ego_item *ego;
	struct ego_desc *choice;

	struct menu menu;
	menu_iter menu_f = { 0, 0, ego_display, ego_action, 0 };
	region area = { 1, 5, -1, -1 };
	int cursor = 0;

	int i;

	/* Create the array */
	choice = mem_zalloc(z_info->e_max * ITYPE_MAX * sizeof(struct ego_desc));

	/* Get the valid ego-items */
	for (i = 0; i < z_info->e_max; i++) {
		int itype;
		ego = &e_info[i];

		/* Only valid known ego-items allowed */
		if (!ego->name || !ego->everseen)
			continue;

		/* Find appropriate ignore types */
		for (itype = ITYPE_NONE + 1; itype < ITYPE_MAX; itype++)
			if (ego_has_ignore_type(ego, itype)) {

				/* Fill in the details */
				choice[max_num].e_idx = i;
				choice[max_num].itype = itype;
				choice[max_num].short_name = strip_ego_name(ego->name);

				++max_num;
			}
	}

	/* Quickly sort the array by ego-item name */
	qsort(choice, max_num, sizeof(choice[0]), ego_comp_func);

	/* Return here if there are no objects */
	if (!max_num) {
		mem_free(choice);
		return;
	}


	/* Save the screen and clear it */
	screen_save();
	clear_from(0);

	/* Help text */
	prt("Ego item ignore menu", 0, 0);

	/* Output to the screen */
	text_out_hook = text_out_to_screen;

	/* Indent output */
	text_out_indent = 1;
	text_out_wrap = 79;
	Term_gotoxy(1, 1);

	/* Display some helpful information */
	text_out_e(EGO_MENU_HELPTEXT);

	text_out_indent = 0;

	/* Set up the menu */
	memset(&menu, 0, sizeof(menu));
	menu_init(&menu, MN_SKIN_SCROLL, &menu_f);
	menu_setpriv(&menu, max_num, choice);
	menu_layout(&menu, &area);

	/* Select an entry */
	(void) menu_select(&menu, cursor, false);

	/* Free memory */
	mem_free(choice);

	/* Load screen */
	screen_load();

	return;
}